

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9HashmapValuesToSet(jx9_hashmap *pMap,SySet *pOut)

{
  jx9_vm *pjVar1;
  void *pvVar2;
  sxu32 sVar3;
  uint uVar4;
  uint uVar5;
  jx9_hashmap_node *pjVar6;
  jx9_value *pValue;
  long local_30;
  
  pjVar6 = pMap->pFirst;
  pjVar1 = pMap->pVm;
  pOut->nUsed = 0;
  pOut->nSize = 0;
  pOut->eSize = 8;
  pOut->nCursor = 0;
  pOut->pAllocator = &pjVar1->sAllocator;
  sVar3 = 0;
  pOut->pBase = (void *)0x0;
  pOut->pUserData = (void *)0x0;
  uVar4 = pMap->nEntry;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      pjVar1 = pjVar6->pMap->pVm;
      if ((pjVar6->nValIdx < (pjVar1->aMemObj).nUsed) &&
         (pvVar2 = (pjVar1->aMemObj).pBase,
         local_30 = (ulong)(pjVar6->nValIdx * (pjVar1->aMemObj).eSize) + (long)pvVar2,
         pvVar2 != (void *)0x0)) {
        SySetPut(pOut,&local_30);
        uVar4 = pMap->nEntry;
      }
      pjVar6 = pjVar6->pPrev;
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
    sVar3 = pOut->nUsed;
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE int jx9HashmapValuesToSet(jx9_hashmap *pMap, SySet *pOut)
{
	jx9_hashmap_node *pEntry = pMap->pFirst;
	jx9_value *pValue;
	sxu32 n;
	/* Initialize the container */
	SySetInit(pOut, &pMap->pVm->sAllocator, sizeof(jx9_value *));
	for(n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extract node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			SySetPut(pOut, (const void *)&pValue);
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* Total inserted entries */
	return (int)SySetUsed(pOut);
}